

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::FinalizeTargetCompileInfo(cmGlobalGenerator *this)

{
  const_iterator cVar1;
  bool bVar2;
  TargetType TVar3;
  size_type sVar4;
  reference ppcVar5;
  vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> *__x;
  cmTargets *this_00;
  pointer ppVar6;
  reference entry;
  reference s;
  char *value;
  string local_118;
  allocator local_f1;
  undefined1 local_f0 [8];
  string defPropName;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  const_iterator ci;
  undefined1 local_98 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  const_iterator cStack_78;
  PolicyStatus polSt;
  __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
  local_70;
  const_iterator it;
  cmTarget *t;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  local_58;
  iterator ti;
  cmTargets *targets;
  vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> noconfig_compile_definitions;
  cmMakefile *mf;
  uint i;
  cmGlobalGenerator *this_local;
  
  for (mf._4_4_ = 0;
      sVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                        (&this->LocalGenerators), mf._4_4_ < sVar4; mf._4_4_ = mf._4_4_ + 1) {
    ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&this->LocalGenerators,(ulong)mf._4_4_);
    noconfig_compile_definitions.
    super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)cmLocalGenerator::GetMakefile(*ppcVar5);
    __x = cmMakefile::GetCompileDefinitionsEntries
                    ((cmMakefile *)
                     noconfig_compile_definitions.
                     super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::vector
              ((vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> *)&targets,__x);
    this_00 = cmMakefile::GetTargets_abi_cxx11_
                        ((cmMakefile *)
                         noconfig_compile_definitions.
                         super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_58._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
         ::begin(this_00);
    while( true ) {
      t = (cmTarget *)
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
          ::end(this_00);
      bVar2 = std::__detail::operator!=
                        (&local_58,
                         (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                          *)&t);
      if (!bVar2) break;
      ppVar6 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                             *)&local_58);
      it._M_current = (cmValueWithOrigin *)&ppVar6->second;
      cmTarget::AppendBuildInterfaceIncludes((cmTarget *)it._M_current);
      TVar3 = cmTarget::GetType((cmTarget *)it._M_current);
      if (TVar3 != INTERFACE_LIBRARY) {
        local_70._M_current =
             (cmValueWithOrigin *)
             std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::begin
                       ((vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> *)&targets);
        while( true ) {
          cStack_78 = std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::end
                                ((vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> *)
                                 &targets);
          bVar2 = __gnu_cxx::operator!=(&local_70,&stack0xffffffffffffff88);
          cVar1 = it;
          if (!bVar2) break;
          entry = __gnu_cxx::
                  __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
                  ::operator*(&local_70);
          cmTarget::InsertCompileDefinition((cmTarget *)cVar1._M_current,entry);
          __gnu_cxx::
          __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
          ::operator++(&local_70);
        }
        configs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             cmMakefile::GetPolicyStatus
                       ((cmMakefile *)
                        noconfig_compile_definitions.
                        super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,CMP0043);
        if ((configs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == WARN) ||
           (configs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == OLD)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_98);
          cmMakefile::GetConfigurations
                    ((string *)&ci,
                     (cmMakefile *)
                     noconfig_compile_definitions.
                     super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_98,true);
          std::__cxx11::string::~string((string *)&ci);
          local_c8._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_98);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&local_c0,&local_c8);
          while( true ) {
            defPropName.field_2._8_8_ =
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_98);
            bVar2 = __gnu_cxx::operator!=
                              (&local_c0,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&defPropName.field_2 + 8));
            if (!bVar2) break;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)local_f0,"COMPILE_DEFINITIONS_",&local_f1);
            std::allocator<char>::~allocator((allocator<char> *)&local_f1);
            s = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_c0);
            cmsys::SystemTools::UpperCase(&local_118,s);
            std::__cxx11::string::operator+=((string *)local_f0,(string *)&local_118);
            std::__cxx11::string::~string((string *)&local_118);
            cVar1 = it;
            value = cmMakefile::GetProperty
                              ((cmMakefile *)
                               noconfig_compile_definitions.
                               super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_f0
                              );
            cmTarget::AppendProperty((cmTarget *)cVar1._M_current,(string *)local_f0,value,false);
            std::__cxx11::string::~string((string *)local_f0);
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_c0);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_98);
        }
      }
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                    *)&local_58);
    }
    std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::~vector
              ((vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> *)&targets);
  }
  return;
}

Assistant:

void cmGlobalGenerator::FinalizeTargetCompileInfo()
{
  // Construct per-target generator information.
  for(unsigned int i=0; i < this->LocalGenerators.size(); ++i)
    {
    cmMakefile *mf = this->LocalGenerators[i]->GetMakefile();

    const std::vector<cmValueWithOrigin> noconfig_compile_definitions =
                                mf->GetCompileDefinitionsEntries();

    cmTargets& targets = mf->GetTargets();
    for(cmTargets::iterator ti = targets.begin();
        ti != targets.end(); ++ti)
      {
      cmTarget* t = &ti->second;

      t->AppendBuildInterfaceIncludes();

      if (t->GetType() == cmTarget::INTERFACE_LIBRARY)
        {
        continue;
        }

      for (std::vector<cmValueWithOrigin>::const_iterator it
                                      = noconfig_compile_definitions.begin();
          it != noconfig_compile_definitions.end(); ++it)
        {
        t->InsertCompileDefinition(*it);
        }

      cmPolicies::PolicyStatus polSt
                                  = mf->GetPolicyStatus(cmPolicies::CMP0043);
      if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD)
        {
        std::vector<std::string> configs;
        mf->GetConfigurations(configs);

        for(std::vector<std::string>::const_iterator ci = configs.begin();
            ci != configs.end(); ++ci)
          {
          std::string defPropName = "COMPILE_DEFINITIONS_";
          defPropName += cmSystemTools::UpperCase(*ci);
          t->AppendProperty(defPropName,
                            mf->GetProperty(defPropName));
          }
        }
      }
    }
}